

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ToObject(JSContext *ctx,JSValue val)

{
  uint uVar1;
  JSValue getter;
  JSValue setter;
  JSClassID class_id;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSRefCountHeader *p;
  JSValue JVar5;
  uint uStack_44;
  uint uStack_34;
  
  JVar3 = val.u;
  uVar1 = (uint)val.tag;
  switch(uVar1) {
  case 0:
  case 7:
    JVar4 = (JSValueUnion)ctx->class_proto[4].u.ptr;
    iVar2 = ctx->class_proto[4].tag;
    class_id = 4;
    break;
  case 1:
    JVar5 = JS_NewObjectProtoClass(ctx,ctx->class_proto[6],6);
    if ((int)JVar5.tag == 6) {
      return JVar5;
    }
    goto LAB_00120d06;
  case 0xfffffff8:
    JVar4 = (JSValueUnion)ctx->class_proto[7].u.ptr;
    iVar2 = ctx->class_proto[7].tag;
    class_id = 7;
    break;
  case 0xfffffff9:
    JVar5 = JS_NewObjectProtoClass(ctx,ctx->class_proto[5],5);
    getter.tag = 3;
    getter.u.ptr = (void *)((ulong)uStack_34 << 0x20);
    setter.tag = 3;
    setter.u.ptr = (void *)((ulong)uStack_44 << 0x20);
    JS_DefineProperty(ctx,JVar5,0x30,
                      (JSValue)ZEXT416((uint)*(undefined8 *)((long)JVar3.ptr + 4) & 0x7fffffff),
                      getter,setter,0x2700);
    goto LAB_00120cf8;
  default:
    JS_ThrowTypeError(ctx,"cannot convert to object");
    return (JSValue)(ZEXT816(6) << 0x40);
  case 0xffffffff:
  case 6:
    if (uVar1 < 0xfffffff5) {
      return val;
    }
    *(int *)JVar3.ptr = *JVar3.ptr + 1;
    return val;
  }
  JVar5.tag = iVar2;
  JVar5.u.float64 = JVar4.float64;
  JVar5 = JS_NewObjectProtoClass(ctx,JVar5,class_id);
LAB_00120cf8:
  if ((int)JVar5.tag != 6) {
    if (0xfffffff4 < uVar1) {
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
    }
LAB_00120d06:
    JS_SetObjectData(ctx,JVar5,val);
  }
  return JVar5;
}

Assistant:

static JSValue JS_ToObject(JSContext *ctx, JSValueConst val)
{
    int tag = JS_VALUE_GET_NORM_TAG(val);
    JSValue obj;

    switch(tag) {
    default:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        return JS_ThrowTypeError(ctx, "cannot convert to object");
    case JS_TAG_OBJECT:
    case JS_TAG_EXCEPTION:
        return JS_DupValue(ctx, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_INT);
        goto set_value;
    case JS_TAG_BIG_FLOAT:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_FLOAT);
        goto set_value;
    case JS_TAG_BIG_DECIMAL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_DECIMAL);
        goto set_value;
#endif
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
        obj = JS_NewObjectClass(ctx, JS_CLASS_NUMBER);
        goto set_value;
    case JS_TAG_STRING:
        /* XXX: should call the string constructor */
        {
            JSString *p1 = JS_VALUE_GET_STRING(val);
            obj = JS_NewObjectClass(ctx, JS_CLASS_STRING);
            JS_DefinePropertyValue(ctx, obj, JS_ATOM_length, JS_NewInt32(ctx, p1->len), 0);
        }
        goto set_value;
    case JS_TAG_BOOL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BOOLEAN);
        goto set_value;
    case JS_TAG_SYMBOL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_SYMBOL);
    set_value:
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, JS_DupValue(ctx, val));
        return obj;
    }
}